

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O1

int Lf_MemSaveCut(Lf_Mem_t *p,Lf_Cut_t *pCut,int iObj)

{
  byte bVar1;
  uint uVar2;
  Vec_Ptr_t *pVVar3;
  bool bVar4;
  uint uVar5;
  void *pvVar6;
  void **ppvVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  undefined1 uVar11;
  byte *pbVar12;
  int iVar13;
  uint uVar14;
  
  if ((pCut->field_0x16 & 0x80) != 0) {
    __assert_fail("!pCut->fMux7",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaLf.c"
                  ,0x211,"int Lf_MemSaveCut(Lf_Mem_t *, Lf_Cut_t *, int)");
  }
  uVar2 = p->iCur;
  if ((p->vPages).nSize != (int)uVar2 >> ((byte)p->LogPage & 0x1f)) goto LAB_006d48b8;
  pVVar3 = p->vFree;
  iVar13 = pVVar3->nSize;
  if (iVar13 == 0) {
    pvVar6 = malloc((long)p->MaskPage + 1);
  }
  else {
    if (iVar13 < 1) {
      __assert_fail("p->nSize > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                    ,0x2cc,"void *Vec_PtrPop(Vec_Ptr_t *)");
    }
    pVVar3->nSize = iVar13 - 1U;
    pvVar6 = pVVar3->pArray[iVar13 - 1U];
  }
  uVar5 = (p->vPages).nCap;
  if ((p->vPages).nSize == uVar5) {
    if ((int)uVar5 < 0x10) {
      ppvVar7 = (p->vPages).pArray;
      if (ppvVar7 == (void **)0x0) {
        ppvVar7 = (void **)malloc(0x80);
      }
      else {
        ppvVar7 = (void **)realloc(ppvVar7,0x80);
      }
      (p->vPages).pArray = ppvVar7;
      iVar13 = 0x10;
    }
    else {
      iVar13 = uVar5 * 2;
      if (iVar13 <= (int)uVar5) goto LAB_006d48a6;
      ppvVar7 = (p->vPages).pArray;
      if (ppvVar7 == (void **)0x0) {
        ppvVar7 = (void **)malloc((ulong)uVar5 << 4);
      }
      else {
        ppvVar7 = (void **)realloc(ppvVar7,(ulong)uVar5 << 4);
      }
      (p->vPages).pArray = ppvVar7;
    }
    (p->vPages).nCap = iVar13;
  }
LAB_006d48a6:
  iVar13 = (p->vPages).nSize;
  (p->vPages).nSize = iVar13 + 1;
  (p->vPages).pArray[iVar13] = pvVar6;
LAB_006d48b8:
  if ((~p->iCur & p->MaskPage) < 0x38) {
    __assert_fail("p->MaskPage - (p->iCur & p->MaskPage) >= 4 * (LF_LEAF_MAX + 2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaLf.c"
                  ,0x214,"int Lf_MemSaveCut(Lf_Mem_t *, Lf_Cut_t *, int)");
  }
  uVar5 = p->iCur >> ((byte)p->LogPage & 0x1f);
  if ((-1 < (int)uVar5) && ((int)uVar5 < (p->vPages).nSize)) {
    uVar8 = p->MaskPage & uVar2;
    pvVar6 = (p->vPages).pArray[uVar5];
    uVar11 = (undefined1)((uint)*(int *)&pCut->field_0x14 >> 0x18);
    if (*(int *)&pCut->field_0x14 < 0) {
      *(undefined1 *)((long)pvVar6 + (long)(int)uVar8) = uVar11;
      uVar8 = uVar8 + 1;
      uVar11 = 1;
    }
    *(undefined1 *)((long)pvVar6 + (long)(int)uVar8) = uVar11;
    uVar8 = uVar8 + 1;
    if (0xffffff < *(uint *)&pCut->field_0x14) {
      uVar9 = (ulong)(*(uint *)&pCut->field_0x14 >> 0x18);
      do {
        uVar5 = iObj - *(int *)(&pCut->field_0x14 + uVar9 * 4);
        if (0x7f < uVar5) {
          pbVar12 = (byte *)((long)(int)uVar8 + (long)pvVar6);
          uVar14 = uVar5;
          do {
            *pbVar12 = (byte)uVar14 | 0x80;
            uVar5 = uVar14 >> 7;
            pbVar12 = pbVar12 + 1;
            uVar8 = uVar8 + 1;
            bVar4 = 0x3fff < uVar14;
            uVar14 = uVar5;
          } while (bVar4);
        }
        *(char *)((long)pvVar6 + (long)(int)uVar8) = (char)uVar5;
        iObj = *(int *)(&pCut->field_0x14 + uVar9 * 4);
        uVar8 = uVar8 + 1;
        bVar4 = 1 < (long)uVar9;
        uVar9 = uVar9 - 1;
      } while (bVar4);
    }
    if ((*(uint *)&pCut->field_0x14 < 0x2000000) && (3 < pCut->iFunc)) {
      __assert_fail("pCut->nLeaves >= 2 || pCut->iFunc <= 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaLf.c"
                    ,0x21a,"int Lf_MemSaveCut(Lf_Mem_t *, Lf_Cut_t *, int)");
    }
    uVar5 = pCut->iFunc;
    if (-1 < (int)uVar5) {
      if (0x7f < uVar5) {
        pbVar12 = (byte *)((long)(int)uVar8 + (long)pvVar6);
        uVar14 = uVar5;
        do {
          *pbVar12 = (byte)uVar14 | 0x80;
          uVar5 = uVar14 >> 7;
          pbVar12 = pbVar12 + 1;
          uVar8 = uVar8 + 1;
          bVar4 = 0x3fff < uVar14;
          uVar14 = uVar5;
        } while (bVar4);
      }
      lVar10 = (long)(int)uVar8;
      uVar8 = uVar8 + 1;
      *(char *)((long)pvVar6 + lVar10) = (char)uVar5;
    }
    if ((int)(~uVar8 & p->MaskPage) < 0x38) {
      bVar1 = (byte)p->LogPage;
      uVar8 = (p->iCur >> (bVar1 & 0x1f)) + 1 << (bVar1 & 0x1f);
    }
    else {
      uVar8 = p->iCur & ~p->MaskPage | uVar8;
    }
    p->iCur = uVar8;
    return uVar2;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

static inline int Lf_MemSaveCut( Lf_Mem_t * p, Lf_Cut_t * pCut, int iObj )
{
    unsigned char * pPlace;
    int i, iPlace, Prev = iObj, iCur = p->iCur;
    assert( !pCut->fMux7 );
    if ( Vec_PtrSize(&p->vPages) == (p->iCur >> p->LogPage) )
        Vec_PtrPush( &p->vPages, Vec_PtrSize(p->vFree) ? Vec_PtrPop(p->vFree) : ABC_ALLOC(char,p->MaskPage+1) );
    assert( p->MaskPage - (p->iCur & p->MaskPage) >= 4 * (LF_LEAF_MAX + 2) );
    iPlace = iCur & p->MaskPage;
    pPlace = (unsigned char *)Vec_PtrEntry(&p->vPages, p->iCur >> p->LogPage);
    iPlace = Gia_AigerWriteUnsignedBuffer( pPlace, iPlace, pCut->nLeaves );
    for ( i = pCut->nLeaves - 1; i >= 0; i-- )
        iPlace = Gia_AigerWriteUnsignedBuffer( pPlace, iPlace, Prev - pCut->pLeaves[i] ), Prev = pCut->pLeaves[i];
    assert( pCut->nLeaves >= 2 || pCut->iFunc <= 3 );
    if ( pCut->iFunc >= 0 )
        iPlace = Gia_AigerWriteUnsignedBuffer( pPlace, iPlace, pCut->iFunc );
    if ( p->MaskPage - (iPlace & p->MaskPage) < 4 * (LF_LEAF_MAX + 2) )
        p->iCur = ((p->iCur >> p->LogPage) + 1) << p->LogPage;
    else
        p->iCur = (p->iCur & ~p->MaskPage) | iPlace;
    return iCur;
}